

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Ses_ManCreateMainClause(Ses_Man_t *pSes,int t,int i,int j,int k,int a,int b,int c)

{
  int iVar1;
  int local_3c;
  int local_38;
  int ctr;
  int pLits [5];
  int a_local;
  int k_local;
  int j_local;
  int i_local;
  int t_local;
  Ses_Man_t *pSes_local;
  
  pLits[3] = a;
  pLits[4] = k;
  iVar1 = Ses_ManSelectVar(pSes,i,j,k);
  local_38 = Abc_Var2Lit(iVar1,1);
  iVar1 = Ses_ManSimVar(pSes,i,t);
  ctr = Abc_Var2Lit(iVar1,pLits[3]);
  local_3c = 2;
  if (j < pSes->nSpecVars) {
    if ((uint)((t + 1U & 1 << ((byte)j & 0x1f)) != 0) != b) {
      return;
    }
  }
  else {
    iVar1 = Ses_ManSimVar(pSes,j - pSes->nSpecVars,t);
    pLits[0] = Abc_Var2Lit(iVar1,b);
    local_3c = 3;
  }
  if (pLits[4] < pSes->nSpecVars) {
    if ((uint)((t + 1U & 1 << ((byte)pLits[4] & 0x1f)) != 0) != c) {
      return;
    }
  }
  else {
    iVar1 = Ses_ManSimVar(pSes,pLits[4] - pSes->nSpecVars,t);
    iVar1 = Abc_Var2Lit(iVar1,c);
    (&local_38)[local_3c] = iVar1;
    local_3c = local_3c + 1;
  }
  if ((0 < b) || (0 < c)) {
    iVar1 = Ses_ManGateVar(pSes,i,b,c);
    iVar1 = Abc_Var2Lit(iVar1,1 - pLits[3]);
    (&local_38)[local_3c] = iVar1;
    local_3c = local_3c + 1;
  }
  sat_solver_addclause(pSes->pSat,&local_38,&local_38 + local_3c);
  return;
}

Assistant:

static inline void Ses_ManCreateMainClause( Ses_Man_t * pSes, int t, int i, int j, int k, int a, int b, int c )
{
    int pLits[5], ctr = 0;

    pLits[ctr++] = Abc_Var2Lit( Ses_ManSelectVar( pSes, i, j, k ), 1 );
    pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, i, t ), a );

    if ( j < pSes->nSpecVars )
    {
        if ( ( ( ( t + 1 ) & ( 1 << j ) ) ? 1 : 0 ) != b )
            return;
    }
    else
        pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, j - pSes->nSpecVars, t ), b );

    if ( k < pSes->nSpecVars )
    {
        if ( ( ( ( t + 1 ) & ( 1 << k ) ) ? 1 : 0 ) != c )
            return;
    }
    else
        pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, k - pSes->nSpecVars, t ), c );

    if ( b > 0 || c > 0 )
        pLits[ctr++] = Abc_Var2Lit( Ses_ManGateVar( pSes, i, b, c ), 1 - a );

    sat_solver_addclause( pSes->pSat, pLits, pLits + ctr );
}